

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeCellSizeCheck(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  u32 uVar4;
  u8 *puVar5;
  u16 uVar6;
  uint uVar7;
  int iVar8;
  int cellOffset;
  int usableSize;
  u8 *data;
  int pc;
  int sz;
  int i;
  int iCellLast;
  int iCellFirst;
  MemPage *pPage_local;
  
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar4 = pPage->pBt->usableSize;
  sz = uVar4 - 4;
  puVar5 = pPage->aData;
  uVar3 = pPage->cellOffset;
  if (pPage->leaf == '\0') {
    sz = uVar4 - 5;
  }
  pc = 0;
  while( true ) {
    if ((int)(uint)pPage->nCell <= pc) {
      return 0;
    }
    uVar7 = (uint)CONCAT11(puVar5[(int)((uint)uVar3 + pc * 2)],
                           puVar5[(long)(int)((uint)uVar3 + pc * 2) + 1]);
    if ((uVar7 < (uint)uVar1 + (uint)uVar2 * 2) || (sz < (int)uVar7)) break;
    uVar6 = (*pPage->xCellSize)(pPage,puVar5 + (int)uVar7);
    if ((int)uVar4 < (int)(uVar7 + uVar6)) {
      iVar8 = sqlite3CorruptError(0x117fd);
      return iVar8;
    }
    pc = pc + 1;
  }
  iVar8 = sqlite3CorruptError(0x117f8);
  return iVar8;
}

Assistant:

static SQLITE_NOINLINE int btreeCellSizeCheck(MemPage *pPage){
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */
  int i;             /* Index into the cell pointer array */
  int sz;            /* Size of a cell */
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Maximum usable space on the page */
  int cellOffset;    /* Start of cell content area */

  iCellFirst = pPage->cellOffset + 2*pPage->nCell;
  usableSize = pPage->pBt->usableSize;
  iCellLast = usableSize - 4;
  data = pPage->aData;
  cellOffset = pPage->cellOffset;
  if( !pPage->leaf ) iCellLast--;
  for(i=0; i<pPage->nCell; i++){
    pc = get2byteAligned(&data[cellOffset+i*2]);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    sz = pPage->xCellSize(pPage, &data[pc]);
    testcase( pc+sz==usableSize );
    if( pc+sz>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}